

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  bool bVar1;
  iterator this_00;
  reference ppPVar2;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  *in_RDI;
  iterator it;
  ParameterizedTestCaseInfoBase *in_stack_ffffffffffffffd8;
  
  this_00 = std::
            vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ::begin((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                     *)in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
    ::end((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
           *)in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
              ::operator*((__normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                           *)&stack0xfffffffffffffff0);
    in_stack_ffffffffffffffd8 = *ppPVar2;
    if (in_stack_ffffffffffffffd8 != (ParameterizedTestCaseInfoBase *)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd8 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
    ::operator++((__normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
  ::~vector((vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
             *)this_00._M_current);
  return;
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }